

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

size_t __thiscall
cmCTestMultiProcessHandler::GetProcessorsUsed(cmCTestMultiProcessHandler *this,int test)

{
  mapped_type *ppcVar1;
  ulong local_20;
  size_t processors;
  cmCTestMultiProcessHandler *pcStack_10;
  int test_local;
  cmCTestMultiProcessHandler *this_local;
  
  processors._4_4_ = test;
  pcStack_10 = this;
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)((long)&processors + 4));
  local_20 = (ulong)(*ppcVar1)->Processors;
  if (this->ParallelLevel < local_20) {
    local_20 = this->ParallelLevel;
  }
  return local_20;
}

Assistant:

inline size_t cmCTestMultiProcessHandler::GetProcessorsUsed(int test)
{
  size_t processors = static_cast<int>(this->Properties[test]->Processors);
  // If processors setting is set higher than the -j
  // setting, we default to using all of the process slots.
  if (processors > this->ParallelLevel) {
    processors = this->ParallelLevel;
  }
  return processors;
}